

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

void __thiscall Clasp::Cli::ClaspAppBase::printHelp(ClaspAppBase *this,OptionContext *root)

{
  DescriptionLevel DVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  OptionContext *in_RSI;
  ClaspAppBase *in_RDI;
  char *ht3;
  OptionContext *in_stack_00000078;
  Application *in_stack_00000080;
  char *local_18;
  
  Potassco::Application::printHelp(in_stack_00000080,in_stack_00000078);
  DVar1 = Potassco::ProgramOptions::OptionContext::getActiveDescLevel(in_RSI);
  if (0 < (int)DVar1) {
    pcVar3 = ClaspCliConfig::getDefaults(Asp);
    printf("[asp] %s\n",pcVar3);
    pcVar3 = ClaspCliConfig::getDefaults(Sat);
    printf("[cnf] %s\n",pcVar3);
    pcVar3 = ClaspCliConfig::getDefaults(Pb);
    printf("[opb] %s\n",pcVar3);
  }
  DVar1 = Potassco::ProgramOptions::OptionContext::getActiveDescLevel(in_RSI);
  if ((int)DVar1 < 2) {
    local_18 = "\nType ";
    DVar1 = Potassco::ProgramOptions::OptionContext::getActiveDescLevel(in_RSI);
    if (DVar1 == desc_level_default) {
      iVar2 = (**(in_RDI->super_Application)._vptr_Application)();
      printf("\nType \'%s --help=2\' for more options and defaults\n",CONCAT44(extraout_var,iVar2));
      local_18 = "and ";
    }
    iVar2 = (**(in_RDI->super_Application)._vptr_Application)();
    printf("%s \'%s --help=3\' for all options and configurations.\n",local_18,
           CONCAT44(extraout_var_00,iVar2));
  }
  else {
    printf("\nDefault configurations:\n");
    printDefaultConfigs(in_RDI);
  }
  fflush(_stdout);
  return;
}

Assistant:

void ClaspAppBase::printHelp(const Potassco::ProgramOptions::OptionContext& root) {
	Potassco::Application::printHelp(root);
	if (root.getActiveDescLevel() >= Potassco::ProgramOptions::desc_level_e1) {
		printf("[asp] %s\n", ClaspCliConfig::getDefaults(Problem_t::Asp));
		printf("[cnf] %s\n", ClaspCliConfig::getDefaults(Problem_t::Sat));
		printf("[opb] %s\n", ClaspCliConfig::getDefaults(Problem_t::Pb));
	}
	if (root.getActiveDescLevel() >= Potassco::ProgramOptions::desc_level_e2) {
		printf("\nDefault configurations:\n");
		printDefaultConfigs();
	}
	else {
		const char* ht3 = "\nType ";
		if (root.getActiveDescLevel() == Potassco::ProgramOptions::desc_level_default) {
			printf("\nType '%s --help=2' for more options and defaults\n", getName());
			ht3 = "and ";
		}
		printf("%s '%s --help=3' for all options and configurations.\n", ht3, getName());
	}
	fflush(stdout);
}